

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.h
# Opt level: O0

void __thiscall llvm::dwarf::CFIProgram::addInstruction(CFIProgram *this,uint8_t Opcode)

{
  Instruction local_68;
  uint8_t local_11;
  CFIProgram *pCStack_10;
  uint8_t Opcode_local;
  CFIProgram *this_local;
  
  local_11 = Opcode;
  pCStack_10 = this;
  Instruction::Instruction(&local_68,Opcode);
  std::
  vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
  ::push_back(&this->Instructions,&local_68);
  Instruction::~Instruction(&local_68);
  return;
}

Assistant:

void addInstruction(uint8_t Opcode) {
    Instructions.push_back(Instruction(Opcode));
  }